

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_psg.cpp
# Opt level: O3

void __thiscall PSG::MakeNoiseTable(PSG *this)

{
  uint uVar1;
  int i;
  long lVar2;
  int iVar3;
  uint uVar4;
  
  if (noisetable[0] == 0) {
    uVar1 = 0x37f1;
    lVar2 = 0;
    do {
      iVar3 = 0x20;
      uVar4 = 0;
      do {
        uVar4 = (uVar1 & 1) + uVar4 * 2;
        uVar1 = (uVar1 << 0x10 ^ uVar1 << 0xe) & 0x10000 | (int)uVar1 >> 1;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      noisetable[lVar2] = uVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x800);
  }
  return;
}

Assistant:

void PSG::MakeNoiseTable()
{
	if (!noisetable[0])
	{
		int noise = 14321;
		for (int i=0; i<noisetablesize; i++)
		{
			int n = 0;
			for (int j=0; j<32; j++)
			{
				n = n * 2 + (noise & 1);
				noise = (noise >> 1) | (((noise << 14) ^ (noise << 16)) & 0x10000);
			}
			noisetable[i] = n;
		}
	}
}